

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

eStorageDeviceError
ON_BinaryArchive::StorageDeviceErrorFromUnsigned(uint storage_device_error_as_unsigned)

{
  eStorageDeviceError local_c;
  uint storage_device_error_as_unsigned_local;
  
  switch(storage_device_error_as_unsigned) {
  case 0:
    local_c = None;
    break;
  case 0xfffffff1:
    local_c = WriteFailed;
    break;
  case 0xfffffff2:
    local_c = SeekFailedDuringWriting;
    break;
  default:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,0x231,"","Invalid storage_device_error_as_unsigned parmeter.");
    local_c = UnknownDeviceError;
    break;
  case 0xfffffff8:
    local_c = ReadFailed;
    break;
  case 0xfffffff9:
    local_c = SeekFailedDuringReading;
    break;
  case 0xffffffff:
    local_c = UnknownDeviceError;
  }
  return local_c;
}

Assistant:

ON_BinaryArchive::eStorageDeviceError ON_BinaryArchive::StorageDeviceErrorFromUnsigned(
  unsigned int storage_device_error_as_unsigned
  )
{
  switch (storage_device_error_as_unsigned)
  {
  ON_ENUM_FROM_UNSIGNED_CASE(ON_BinaryArchive::eStorageDeviceError::None);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_BinaryArchive::eStorageDeviceError::WriteFailed);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_BinaryArchive::eStorageDeviceError::SeekFailedDuringWriting);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_BinaryArchive::eStorageDeviceError::ReadFailed);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_BinaryArchive::eStorageDeviceError::SeekFailedDuringReading);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_BinaryArchive::eStorageDeviceError::UnknownDeviceError);
  }

  ON_ERROR("Invalid storage_device_error_as_unsigned parmeter.");
  return ON_BinaryArchive::eStorageDeviceError::UnknownDeviceError;
}